

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  cmState *this_00;
  cmCommand *pcVar5;
  cmTarget *pcVar6;
  cmTest *pcVar7;
  ostream *poVar8;
  pointer pcVar9;
  string *psVar10;
  char *pcVar11;
  PolicyID id;
  bool local_632;
  bool local_601;
  bool local_5da;
  bool local_5c2;
  bool local_5b2;
  bool local_582;
  bool local_572;
  bool local_54a;
  bool local_522;
  bool local_512;
  string local_500 [8];
  string env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  byte local_4b1;
  ulong uStack_4b0;
  bool bdef;
  size_t argP1len;
  allocator local_499;
  string local_498;
  string local_478;
  string local_458;
  undefined1 local_438 [8];
  ostringstream e;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  cmTest *local_270;
  cmTest *haveTest;
  allocator local_259;
  string local_258;
  _Self local_238;
  allocator local_229;
  string local_228;
  PolicyID local_204;
  iterator iStack_200;
  PolicyID pid;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  cmCommand *local_1a8;
  cmCommand *command;
  allocator local_191;
  string local_190;
  _Self local_170;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  _Self local_118;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  _Self local_c0;
  allocator local_b1;
  string local_b0;
  _Self local_90 [3];
  allocator local_71;
  string local_70;
  _Self local_50;
  _List_iterator<cmExpandedCommandArgument> local_48;
  iterator argP2;
  iterator argP1;
  iterator arg;
  int reducible;
  MessageType *param_3_local;
  string *param_2_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  do {
    arg._M_node._4_4_ = 0;
    argP1 = std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                      (newArgs);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&argP2);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_48);
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP1,&local_50);
      if (!bVar2) break;
      argP2 = argP1;
      IncrementArguments(this,newArgs,&argP2,&local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_70,"EXISTS",&local_71);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_70,pcVar4);
      local_512 = false;
      if (bVar2) {
        local_90[0]._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_512 = std::operator!=(&argP2,local_90);
      }
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      if (local_512 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        bVar2 = cmsys::SystemTools::FileExists(pcVar11);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b0,"IS_DIRECTORY",&local_b1);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_b0,pcVar4);
      local_522 = false;
      if (bVar2) {
        local_c0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_522 = std::operator!=(&argP2,&local_c0);
      }
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      if (local_522 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e0,pcVar11,&local_e1);
        bVar2 = cmsys::SystemTools::FileIsDirectory(&local_e0);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"IS_SYMLINK",&local_109);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_108,pcVar4);
      local_54a = false;
      if (bVar2) {
        local_118._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_54a = std::operator!=(&argP2,&local_118);
      }
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      if (local_54a != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_138,pcVar11,&local_139);
        bVar2 = cmsys::SystemTools::FileIsSymlink(&local_138);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,"IS_ABSOLUTE",&local_161);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_160,pcVar4);
      local_572 = false;
      if (bVar2) {
        local_170._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_572 = std::operator!=(&argP2,&local_170);
      }
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      if (local_572 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar11);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"COMMAND",&local_191);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_190,pcVar4);
      local_582 = false;
      if (bVar2) {
        command = (cmCommand *)
                  std::__cxx11::
                  list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                            (newArgs);
        local_582 = std::operator!=(&argP2,(_Self *)&command);
      }
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      if (local_582 != false) {
        this_00 = cmMakefile::GetState(this->Makefile);
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c8,pcVar11,&local_1c9);
        pcVar5 = cmState::GetCommand(this_00,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
        local_1a8 = pcVar5;
        HandlePredicate(this,(bool)(-(pcVar5 != (cmCommand *)0x0) & 1),
                        (int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f0,"POLICY",&local_1f1);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_1f0,pcVar4);
      local_5b2 = false;
      if (bVar2) {
        iStack_200 = std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
        local_5b2 = std::operator!=(&argP2,&stack0xfffffffffffffe00);
      }
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      if (local_5b2 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        bVar2 = cmPolicies::GetPolicyID(pcVar11,&local_204);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_228,"TARGET",&local_229);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_228,pcVar4);
      local_5c2 = false;
      if (bVar2) {
        local_238._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_5c2 = std::operator!=(&argP2,&local_238);
      }
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if (local_5c2 != false) {
        pcVar1 = this->Makefile;
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
        pcVar6 = cmMakefile::FindTargetToUse(pcVar1,psVar10,false);
        HandlePredicate(this,(bool)(-(pcVar6 != (cmTarget *)0x0) & 1),
                        (int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      if ((this->Policy64Status == OLD) || (this->Policy64Status == WARN)) {
        local_601 = false;
        if (this->Policy64Status == WARN) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2b8,"TEST",&local_2b9);
          pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
          local_601 = IsKeyword(this,&local_2b8,pcVar4);
          std::__cxx11::string::~string((string *)&local_2b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        }
        if (local_601 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_458,(cmPolicies *)0x40,id);
          poVar8 = std::operator<<((ostream *)local_438,(string *)&local_458);
          std::operator<<(poVar8,"\n");
          std::__cxx11::string::~string((string *)&local_458);
          std::operator<<((ostream *)local_438,
                          "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                         );
          pcVar1 = this->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_478,false);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_258,"TEST",&local_259);
        pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        bVar2 = IsKeyword(this,&local_258,pcVar4);
        local_5da = false;
        if (bVar2) {
          haveTest = (cmTest *)
                     std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
          local_5da = std::operator!=(&argP2,(_Self *)&haveTest);
        }
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)&local_259);
        if (local_5da != false) {
          pcVar1 = this->Makefile;
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_290,pcVar11,&local_291);
          pcVar7 = cmMakefile::GetTest(pcVar1,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          std::allocator<char>::~allocator((allocator<char> *)&local_291);
          local_270 = pcVar7;
          HandlePredicate(this,(bool)(-(pcVar7 != (cmTest *)0x0) & 1),
                          (int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_498,"DEFINED",&local_499);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&local_498,pcVar4);
      local_632 = false;
      if (bVar2) {
        argP1len = (size_t)std::__cxx11::
                           list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ::end(newArgs);
        local_632 = std::operator!=(&argP2,(_Self *)&argP1len);
      }
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
      if (local_632 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
        uStack_4b0 = std::__cxx11::string::size();
        local_4b1 = 0;
        env.field_2._M_local_buf[0xf] = '\0';
        bVar2 = false;
        if (4 < uStack_4b0) {
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
          std::__cxx11::string::substr((ulong)&local_4d8,(ulong)psVar10);
          env.field_2._M_local_buf[0xf] = '\x01';
          bVar3 = std::operator==(&local_4d8,"ENV{");
          bVar2 = false;
          if (bVar3) {
            pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
            psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)psVar10);
            bVar2 = *pcVar11 == '}';
          }
        }
        if ((env.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_4d8);
        }
        if (bVar2) {
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
          std::__cxx11::string::substr((ulong)local_500,(ulong)psVar10);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          pcVar11 = cmsys::SystemTools::GetEnv(pcVar11);
          local_4b1 = -(pcVar11 != (char *)0x0) & 1;
          std::__cxx11::string::~string(local_500);
        }
        else {
          pcVar1 = this->Makefile;
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
          local_4b1 = cmMakefile::IsDefinitionSet(pcVar1,psVar10);
        }
        HandlePredicate(this,(bool)(local_4b1 & 1),(int *)((long)&arg._M_node + 4),&argP1,newArgs,
                        &argP2,&local_48);
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&argP1);
    }
  } while (arg._M_node._4_4_ != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList &newArgs,
                  std::string &, cmake::MessageType &)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      // does a file exist
      if (this->IsKeyword("EXISTS", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileExists(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a directory with this name exist
      if (this->IsKeyword("IS_DIRECTORY", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsDirectory(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a symlink with this name exist
      if (this->IsKeyword("IS_SYMLINK", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsSymlink(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // is the given path an absolute path ?
      if (this->IsKeyword("IS_ABSOLUTE", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsFullPath(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a command exist
      if (this->IsKeyword("COMMAND", *arg) && argP1 != newArgs.end())
        {
        cmCommand* command =
            this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(
          command ? true : false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a policy exist
      if (this->IsKeyword("POLICY", *arg) && argP1 != newArgs.end())
        {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(
          cmPolicies::GetPolicyID(argP1->c_str(), pid),
            reducible, arg, newArgs, argP1, argP2);
        }
      // does a target exist
      if (this->IsKeyword("TARGET", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue())?true:false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a test exist
      if(this->Policy64Status != cmPolicies::OLD &&
        this->Policy64Status != cmPolicies::WARN)
        {
        if (this->IsKeyword("TEST", *arg) && argP1 != newArgs.end())
          {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(
            haveTest?true:false,
            reducible, arg, newArgs, argP1, argP2);
          }
        }
      else if(this->Policy64Status == cmPolicies::WARN &&
        this->IsKeyword("TEST", *arg))
        {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
          "when the policy is set to NEW.  "
          "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      // is a variable defined
      if (this->IsKeyword("DEFINED", *arg) && argP1 != newArgs.end())
        {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if(argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
           argP1->GetValue().operator[](argP1len-1) == '}')
          {
          std::string env = argP1->GetValue().substr(4, argP1len-5);
          bdef = cmSystemTools::GetEnv(env.c_str())?true:false;
          }
        else
          {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
          }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}